

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O3

int av1_compute_rd_mult_based_on_qindex
              (aom_bit_depth_t bit_depth,FRAME_UPDATE_TYPE update_type,int qindex,
              aom_tune_metric tuning)

{
  int16_t iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  undefined7 in_register_00000031;
  double dVar7;
  double dVar8;
  
  iVar1 = av1_dc_quant_QTX(qindex,0,bit_depth);
  iVar3 = (int)iVar1;
  if ((int)CONCAT71(in_register_00000031,update_type) == 0) {
    dVar8 = (double)iVar3 * 0.0015 + 3.3;
    dVar7 = (double)(iVar3 * iVar3);
  }
  else {
    dVar8 = (double)(iVar3 * iVar3);
    if ((update_type & 0xfe) == 2) {
      dVar7 = (double)iVar3 * 0.0015 + 3.25;
    }
    else {
      dVar7 = (double)iVar3 * 0.0015 + 3.2;
    }
  }
  lVar4 = (long)(dVar7 * dVar8);
  if ((tuning & ~AOM_TUNE_SSIM) == AOM_TUNE_IQ) {
    iVar3 = (0xff - qindex) * 3;
    iVar2 = (0xff - qindex) * 3 + 3;
    if (-1 < iVar3) {
      iVar2 = iVar3;
    }
    uVar5 = 0x48;
    if ((uint)(iVar2 >> 2) < 0x48) {
      uVar5 = iVar2 >> 2;
    }
    uVar5 = uVar5 | 0x80;
    if (0x100 < qindex) {
      uVar5 = 0x80;
    }
    lVar4 = (long)((double)(int)uVar5 * (double)lVar4 * 0.0078125);
  }
  if (bit_depth != AOM_BITS_8) {
    if (bit_depth == AOM_BITS_12) {
      lVar4 = lVar4 + 0x80 >> 8;
    }
    else {
      if (bit_depth != AOM_BITS_10) {
        return -1;
      }
      lVar4 = lVar4 + 8 >> 4;
    }
  }
  lVar6 = 0x7fffffff;
  if (lVar4 < 0x7fffffff) {
    lVar6 = lVar4;
  }
  iVar3 = 1;
  if (0 < lVar4) {
    iVar3 = (int)lVar6;
  }
  return iVar3;
}

Assistant:

int av1_compute_rd_mult_based_on_qindex(aom_bit_depth_t bit_depth,
                                        FRAME_UPDATE_TYPE update_type,
                                        int qindex, aom_tune_metric tuning) {
  const int q = av1_dc_quant_QTX(qindex, 0, bit_depth);
  int64_t rdmult = q * q;
  if (update_type == KF_UPDATE) {
    double def_rd_q_mult = def_kf_rd_multiplier(q);
    rdmult = (int64_t)((double)rdmult * def_rd_q_mult);
  } else if ((update_type == GF_UPDATE) || (update_type == ARF_UPDATE)) {
    double def_rd_q_mult = def_arf_rd_multiplier(q);
    rdmult = (int64_t)((double)rdmult * def_rd_q_mult);
  } else {
    double def_rd_q_mult = def_inter_rd_multiplier(q);
    rdmult = (int64_t)((double)rdmult * def_rd_q_mult);
  }

  if (tuning == AOM_TUNE_IQ || tuning == AOM_TUNE_SSIMULACRA2) {
    // Further multiply rdmult (by up to 200/128 = 1.5625) to improve image
    // quality. The most noticeable effect is a mild bias towards choosing
    // larger transform sizes (e.g. one 16x16 transform instead of 4 8x8
    // transforms).
    // For very high qindexes, start progressively reducing the weight towards
    // unity (128/128), as transforms are large enough and making them even
    // larger actually harms subjective quality and SSIMULACRA 2 scores.
    // This weight part of the equation was determined by iteratively increasing
    // weight on CID22 and Daala's subset1, and observing its effects on visual
    // quality and SSIMULACRA 2 scores along the usable (0-100) range.
    // The ramp-down part of the equation was determined by choosing a fixed
    // initial qindex point [qindex 159 = (255 - 159) * 3 / 4] where SSIMULACRA
    // 2 scores for encodes with qindexes greater than 159 scored at or above
    // their equivalents with no rdmult adjustment.
    const int weight = clamp(((255 - qindex) * 3) / 4, 0, 72) + 128;
    rdmult = (int64_t)((double)rdmult * weight / 128.0);
  }

  switch (bit_depth) {
    case AOM_BITS_8: break;
    case AOM_BITS_10: rdmult = ROUND_POWER_OF_TWO(rdmult, 4); break;
    case AOM_BITS_12: rdmult = ROUND_POWER_OF_TWO(rdmult, 8); break;
    default:
      assert(0 && "bit_depth should be AOM_BITS_8, AOM_BITS_10 or AOM_BITS_12");
      return -1;
  }
  return rdmult > 0 ? (int)AOMMIN(rdmult, INT_MAX) : 1;
}